

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrF
          (X3DImporter *this,int pAttrIdx,vector<float,_std::allocator<float>_> *pValue)

{
  FIReader *pFVar1;
  pointer pfVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  size_t sVar6;
  size_t sVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  long lVar9;
  double dVar10;
  float local_50;
  undefined4 uStack_4c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  WordIterator local_40;
  char *pcVar5;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_50,pFVar1,pAttrIdx);
  if (CONCAT44(uStack_4c,local_50) == 0) {
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar9 = 0;
  }
  else {
    lVar4 = __dynamic_cast(CONCAT44(uStack_4c,local_50),&FIValue::typeinfo,&FIFloatValue::typeinfo);
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar9 = 0;
    if (lVar4 != 0) {
      lVar9 = lVar4;
      if (local_48 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var8 = local_48;
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_48->_M_use_count = local_48->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_48->_M_use_count = local_48->_M_use_count + 1;
        }
      }
    }
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (lVar9 == 0) {
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar3 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar1,pAttrIdx);
    pcVar5 = (char *)CONCAT44(extraout_var,iVar3);
    pfVar2 = (pValue->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pValue->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish != pfVar2) {
      (pValue->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar2;
    }
    sVar6 = strlen(pcVar5);
    sVar7 = strspn(pcVar5,WordIterator::whitespace);
    local_40.start_ = (char *)0x0;
    if ((long)sVar7 < (long)sVar6) {
      local_40.start_ = pcVar5 + sVar7;
    }
    local_40.end_ = pcVar5 + sVar6;
    if (local_40.start_ != (char *)0x0) {
      pcVar5 = pcVar5 + sVar7;
      do {
        dVar10 = atof(pcVar5);
        local_50 = (float)dVar10;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(pValue,&local_50);
        WordIterator::operator++(&local_40);
        pcVar5 = local_40.start_;
      } while (local_40.start_ != (char *)0x0);
    }
  }
  else {
    std::vector<float,_std::allocator<float>_>::operator=
              (pValue,(vector<float,_std::allocator<float>_> *)(lVar9 + 8));
  }
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrF(const int pAttrIdx, std::vector<float>& pValue)
{
    auto floatValue = std::dynamic_pointer_cast<const FIFloatValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (floatValue) {
        pValue = floatValue->value;
    }
    else {
        const char *val = mReader->getAttributeValue(pAttrIdx);
        pValue.clear();

        //std::cregex_iterator wordItBegin(val, val + strlen(val), pattern_nws);
        //const std::cregex_iterator wordItEnd;
        //std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const std::cmatch &match) { return std::stof(match.str()); });

        WordIterator wordItBegin(val, val + strlen(val));
        WordIterator wordItEnd;
        std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const char *match) { return static_cast<float>(atof(match)); });
    }
}